

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::BuildSubbands(v3i *N3,int NLevels,u64 TransformOrder,array<idx2::subband> *Subbands)

{
  undefined8 uVar1;
  i16 iVar2;
  subband *psVar3;
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 Count;
  long *plVar4;
  long lVar5;
  u64 auStack_5190 [335];
  grid local_4718;
  undefined2 local_46fb;
  char local_46f9;
  grid *local_46f8;
  subband *Sband;
  i64 I_2;
  i64 Sz;
  subband local_46a0;
  subband local_4660;
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 local_461e;
  char local_461c;
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 local_461b;
  char local_4619;
  undefined1 auStack_4618 [2];
  v3<signed_char> NextLowHigh3;
  v3<signed_char> NextLevel3;
  grid_split Gs;
  grid *G;
  undefined1 local_45d8 [4];
  i16 I_1;
  i16 Sz_2;
  short local_4598;
  i16 local_4596;
  dimension local_4594;
  i16 I;
  i16 Sz_1;
  int D;
  stack_array<idx2::grid,_32> Grids;
  array<idx2::subband> *paStack_4280;
  v3<signed_char> MaxLevel3;
  u64 PrevOrder;
  undefined1 auStack_4270 [7];
  i8 Level;
  u64 local_4268;
  u64 local_4260;
  u64 local_4258;
  u64 local_4250;
  u64 local_4248;
  anon_union_3_8_3dedac88_for_v3<signed_char>_1 local_4240;
  anon_union_3_8_3dedac88_for_v3<signed_char>_1 local_423d;
  anon_union_3_8_3dedac88_for_v3<signed_char>_1 local_423a;
  i8 local_4237;
  undefined1 local_4230 [8];
  circular_queue<idx2::subband,_256> Queue;
  array<idx2::subband> *Subbands_local;
  u64 TransformOrder_local;
  int NLevels_local;
  v3i *N3_local;
  undefined4 local_1f8;
  undefined4 local_1f4;
  v3i *local_1f0;
  undefined1 *local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  v3i *local_1c0;
  u64 *local_1b8;
  undefined4 local_1ac;
  undefined4 *local_1a8;
  int local_19c;
  i16 *local_198;
  int local_18c;
  i16 *local_188;
  i16 local_180;
  i16 iStack_17e;
  undefined4 uStack_17c;
  subband *local_178;
  i16 local_170;
  i16 iStack_16e;
  undefined4 uStack_16c;
  array<idx2::subband> *local_168;
  long local_160;
  array<idx2::subband> *local_158;
  v3i *local_150;
  undefined1 local_141;
  anon_union_3_8_3dedac88_for_v3<signed_char>_1 *local_140;
  undefined1 local_131;
  anon_union_3_8_3dedac88_for_v3<signed_char>_1 *local_130;
  undefined1 local_121;
  anon_union_3_8_3dedac88_for_v3<signed_char>_1 *local_120;
  undefined1 local_111;
  undefined1 *local_110;
  subband *local_108;
  long *local_100;
  long local_f8;
  long *local_f0;
  subband *local_e8;
  long *local_e0;
  long local_d8;
  long *local_d0;
  dimension local_c4;
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 *local_c0;
  dimension local_b4;
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 *local_b0;
  dimension local_a4;
  undefined1 *local_a0;
  i16 *local_98;
  grid *local_90;
  undefined2 local_84;
  char local_82;
  char *local_80;
  undefined1 *local_78;
  undefined2 local_6b;
  i16 local_68;
  i16 iStack_66;
  undefined4 uStack_64;
  i16 local_60;
  i16 iStack_5e;
  undefined4 uStack_5c;
  v3i *local_58;
  u64 *local_50;
  v3i *local_48;
  undefined1 *local_40;
  v3i *local_38;
  v3i *local_30;
  undefined4 *local_28;
  long local_20;
  char local_13;
  char local_12;
  char local_11;
  undefined2 *local_10;
  
  Subbands->Size = 0;
  local_160 = (long)(((1 << (1 < (N3->field_0).field_0.X) + (1 < (N3->field_0).field_0.Y) +
                            (1 < (N3->field_0).field_0.Z)) + -1) * NLevels + 1);
  Queue._16392_8_ = Subbands;
  local_168 = Subbands;
  local_158 = Subbands;
  local_150 = N3;
  GrowCapacity<idx2::subband>(Subbands,local_160);
  circular_queue<idx2::subband,_256>::circular_queue
            ((circular_queue<idx2::subband,_256> *)local_4230);
  local_1e8 = auStack_4270;
  _auStack_4270 = 0;
  local_4268 = (long)(int)((N3->field_0).field_0.X & 0x1fffff) +
               (long)(int)((N3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
               ((long)(int)((N3->field_0).field_0.Z & 0x1fffff) << 0x2a);
  local_1d8 = (long)&N3_local + 4;
  local_1dc = 1;
  N3_local._4_4_ = 1;
  local_1f8 = 1;
  local_1f4 = 1;
  local_20 = (long)&N3_local + 4;
  local_4260 = 0x40000200001;
  local_1b8 = &local_4258;
  local_4258 = 0;
  local_4250 = (long)(int)((N3->field_0).field_0.X & 0x1fffff) +
               (long)(int)((N3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
               ((long)(int)((N3->field_0).field_0.Z & 0x1fffff) << 0x2a);
  local_1a8 = &local_1cc;
  local_1ac = 1;
  local_1cc = 1;
  local_1c8 = 1;
  local_1c4 = 1;
  local_28 = &local_1cc;
  local_4248 = 0x40000200001;
  local_140 = &local_4240;
  local_141 = 0;
  local_4240.field_0.X = '\0';
  local_4240.field_0.Y = '\0';
  local_4240.field_0.Z = '\0';
  local_130 = &local_423d;
  local_131 = 0;
  local_423d.field_0.X = '\0';
  local_423d.field_0.Y = '\0';
  local_423d.field_0.Z = '\0';
  local_120 = &local_423a;
  local_121 = 0;
  local_423a.field_0.X = '\0';
  local_423a.field_0.Y = '\0';
  local_423a.field_0.Z = '\0';
  local_4237 = '\0';
  local_1f0 = N3;
  local_1c0 = N3;
  local_58 = N3;
  local_50 = local_1b8;
  local_48 = N3;
  local_40 = local_1e8;
  local_38 = N3;
  local_30 = N3;
  PushBack<idx2::subband,256>
            ((circular_queue<idx2::subband,_256> *)local_4230,(subband *)auStack_4270);
  PrevOrder._7_1_ = '\0';
  local_110 = &Grids.field_0x305;
  local_111 = 0;
  Grids._773_1_ = 0;
  Grids._774_1_ = 0;
  Grids._775_1_ = 0;
  stack_array<idx2::grid,_32>::stack_array((stack_array<idx2::grid,_32> *)&I);
  paStack_4280 = (array<idx2::subband> *)TransformOrder;
  Subbands_local = (array<idx2::subband> *)TransformOrder;
  do {
    while( true ) {
      if (NLevels <= PrevOrder._7_1_) {
        iVar2 = Size<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4230);
        uVar1 = Queue._16392_8_;
        if (0 < iVar2) {
          local_108 = circular_queue<idx2::subband,_256>::operator[]
                                ((circular_queue<idx2::subband,_256> *)local_4230,0);
          local_100 = (long *)uVar1;
          if (*(long *)(uVar1 + 0x20) <= *(long *)(uVar1 + 0x18)) {
            GrowCapacity<idx2::subband>((array<idx2::subband> *)uVar1,0);
          }
          local_f8 = local_100[3];
          local_100[3] = local_f8 + 1;
          local_f0 = local_100;
          memcpy((void *)(*local_100 + local_f8 * 0x40),local_108,0x3a);
        }
        local_90 = (grid *)&I;
        local_98 = &I;
        Reverse<idx2::grid*>(local_90,(grid *)&Grids.Arr[(int)PrevOrder._7_1_].Strd);
        local_180 = Queue.Start;
        iStack_17e = Queue.End;
        uStack_17c = Queue._16396_4_;
        I_2 = *(i64 *)(Queue._16392_8_ + 0x18);
        Sband = (subband *)0x0;
        while( true ) {
          if (I_2 <= (long)Sband) {
            local_68 = Queue.Start;
            iStack_66 = Queue.End;
            uStack_64 = Queue._16396_4_;
            local_60 = Queue.Start;
            iStack_5e = Queue.End;
            uStack_5c = Queue._16396_4_;
            Reverse<idx2::subband*>
                      (*(subband **)Queue._16392_8_,
                       (subband *)
                       (*(long *)Queue._16392_8_ + *(long *)(Queue._16392_8_ + 0x18) * 0x40));
            return;
          }
          local_170 = Queue.Start;
          iStack_16e = Queue.End;
          uStack_16c = Queue._16396_4_;
          local_178 = Sband;
          local_46f8 = (grid *)(*(long *)Queue._16392_8_ + (long)Sband * 0x40);
          local_80 = (char *)((long)&local_46f8[2].super_extent.From + 3);
          local_78 = &Grids.field_0x305;
          local_11 = Grids._773_1_ - *local_80;
          local_12 = Grids._774_1_ - *(char *)((long)&local_46f8[2].super_extent.From + 4);
          local_46f9 = Grids._775_1_ - *(char *)((long)&local_46f8[2].super_extent.From + 5);
          local_10 = &local_6b;
          local_6b._0_1_ = local_11;
          local_6b._1_1_ = local_12;
          local_84 = local_6b;
          local_46fb = local_6b;
          *(undefined2 *)&local_46f8[2].super_extent.From = local_6b;
          *(char *)((long)&local_46f8[2].super_extent.From + 2) = local_46f9;
          *(char *)((long)&local_46f8[2].super_extent.Dims + 1) =
               ((char)NLevels - *(char *)((long)&local_46f8[2].super_extent.Dims + 1)) + -1;
          local_19c = (int)*(char *)((long)&local_46f8[2].super_extent.Dims + 1);
          local_198 = &I;
          local_82 = local_46f9;
          local_13 = local_46f9;
          if (0x1f < local_19c) break;
          MergeSubbandGrids(&local_4718,(grid *)(local_198 + (long)local_19c * 0xc),local_46f8);
          local_46f8[1].super_extent.From = local_4718.super_extent.From;
          local_46f8[1].super_extent.Dims = local_4718.super_extent.Dims;
          local_46f8[1].Strd = local_4718.Strd;
          Sband = (subband *)((long)&(Sband->Grid).super_extent.From + 1);
        }
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                     );
      }
      local_4594 = (dimension)Subbands_local & (Z|Y);
      Subbands_local = (array<idx2::subband> *)((ulong)Subbands_local >> 2);
      if (local_4594 != (Z|Y)) break;
      if (Subbands_local == (array<idx2::subband> *)0x3) {
        Subbands_local = paStack_4280;
      }
      paStack_4280 = Subbands_local;
      local_4596 = Size<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4230);
      local_4598 = local_4596;
      while (uVar1 = Queue._16392_8_, local_4598 = local_4598 + -1, 0 < local_4598) {
        local_e8 = circular_queue<idx2::subband,_256>::operator[]
                             ((circular_queue<idx2::subband,_256> *)local_4230,local_4598);
        local_e0 = (long *)uVar1;
        if (*(long *)(uVar1 + 0x20) <= *(long *)(uVar1 + 0x18)) {
          GrowCapacity<idx2::subband>((array<idx2::subband> *)uVar1,0);
        }
        local_d8 = local_e0[3];
        local_e0[3] = local_d8 + 1;
        local_d0 = local_e0;
        plVar4 = local_e0;
        memcpy((void *)(*local_e0 + local_d8 * 0x40),local_e8,0x3a);
        PopBack<idx2::subband,256>
                  ((subband *)local_45d8,(idx2 *)local_4230,
                   (circular_queue<idx2::subband,_256> *)0x1,(i16)plVar4);
      }
      PrevOrder._7_1_ = PrevOrder._7_1_ + '\x01';
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      local_18c = (int)PrevOrder._7_1_;
      local_188 = &I;
      if (0x1f < local_18c) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                     );
      }
      lVar5 = (long)local_18c;
      *(u64 *)(local_188 + lVar5 * 0xc) = (psVar3->Grid).super_extent.From;
      Grids.Arr[lVar5].super_extent.From = (psVar3->Grid).super_extent.Dims;
      Grids.Arr[lVar5].super_extent.Dims = (psVar3->Grid).Strd;
      Subbands_local = paStack_4280;
    }
    local_a0 = &Grids.field_0x305;
    local_a4 = local_4594;
    if (Z < local_4594) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<signed char>::operator[](int) const [t = signed char]");
    }
    local_a0[(int)local_4594] = local_a0[(int)local_4594] + '\x01';
    iVar2 = Size<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4230);
    for (G._4_2_ = 0; G._4_2_ < iVar2; G._4_2_ = G._4_2_ + 1) {
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      SplitAlternate((grid_split *)auStack_4618,&psVar3->Grid,local_4594);
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      local_461b = (psVar3->Level3).field_0.field_3.XY.field_0;
      local_4619 = (psVar3->Level3).field_0.field_0.Z;
      local_b0 = &local_461b;
      local_b4 = local_4594;
      if (2 < (int)local_4594) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<signed char>::operator[](int) const [t = signed char]");
      }
      local_b0->E[(int)local_4594] = local_b0->E[(int)local_4594] + '\x01';
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      local_461e = (psVar3->LowHigh3).field_0.field_3.XY.field_0;
      local_461c = (psVar3->LowHigh3).field_0.field_0.Z;
      local_c0 = &local_461e;
      local_c4 = local_4594;
      if (2 < (int)local_4594) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<signed char>::operator[](int) const [t = signed char]");
      }
      local_c0->E[(int)local_4594] = '\x01';
      local_4660.Grid.super_extent.From = _auStack_4618;
      local_4660.AccumGrid.super_extent.From = _auStack_4618;
      local_4660.Level3.field_0.field_3.XY.field_0 = (v2<signed_char>)(v2<signed_char>)local_461b;
      local_4660.Level3.field_0.field_0.Z = local_4619;
      local_4660.Level3Rev.field_0.field_3.XY.field_0 = (v2<signed_char>)(v2<signed_char>)local_461b
      ;
      local_4660.Level3Rev.field_0.field_0.Z = local_4619;
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      local_4660.LowHigh3.field_0.field_3.XY.field_0 =
           (v2<signed_char>)(psVar3->LowHigh3).field_0.field_3.XY.field_0;
      local_4660.LowHigh3.field_0.field_0.Z = (psVar3->LowHigh3).field_0.field_0.Z;
      local_4660.Level = PrevOrder._7_1_;
      PushBack<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4230,&local_4660);
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      local_46a0.Level3.field_0.field_3.XY.field_0 =
           (v2<signed_char>)(psVar3->Level3).field_0.field_3.XY.field_0;
      local_46a0.Level3.field_0.field_0.Z = (psVar3->Level3).field_0.field_0.Z;
      psVar3 = circular_queue<idx2::subband,_256>::operator[]
                         ((circular_queue<idx2::subband,_256> *)local_4230,0);
      Count = (psVar3->Level3).field_0.field_3.XY.field_0;
      local_46a0.Level3Rev.field_0.field_0.Z = (psVar3->Level3).field_0.field_0.Z;
      local_46a0.LowHigh3.field_0.field_3.XY.field_0 = (v2<signed_char>)(v2<signed_char>)local_461e;
      local_46a0.LowHigh3.field_0.field_0.Z = local_461c;
      local_46a0.Level = PrevOrder._7_1_;
      local_46a0.Level3Rev.field_0.field_3.XY.field_0 = (v2<signed_char>)Count;
      PushBack<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4230,&local_46a0);
      PopFront<idx2::subband,256>
                ((subband *)&Sz,(idx2 *)local_4230,(circular_queue<idx2::subband,_256> *)0x1,
                 (i16)Count);
    }
  } while( true );
}

Assistant:

void
BuildSubbands(const v3i& N3, int NLevels, u64 TransformOrder, array<subband>* Subbands)
{
  Clear(Subbands);
  Reserve(Subbands, ((1 << NumDims(N3)) - 1) * NLevels + 1);
  circular_queue<subband, 256> Queue;
  PushBack(&Queue, subband{ grid(N3), grid(N3), v3<i8>(0), v3<i8>(0), v3<i8>(0), i8(0) });
  i8 Level = 0;
  u64 PrevOrder = TransformOrder;
  v3<i8> MaxLevel3(0);
  stack_array<grid, 32> Grids;
  while (Level < NLevels)
  {
    idx2_Assert(TransformOrder != 0);
    int D = TransformOrder & 0x3;
    TransformOrder >>= 2;
    if (D == 3)
    {                          // next level
      if (TransformOrder == 3) // next one is the last +
        TransformOrder = PrevOrder;
      else
        PrevOrder = TransformOrder;
      i16 Sz = Size(Queue);
      for (i16 I = Sz - 1; I >= 1; --I)
      {
        PushBack(Subbands, Queue[I]);
        PopBack(&Queue);
      }
      ++Level;
      Grids[Level] = Queue[0].Grid;
    }
    else
    {
      ++MaxLevel3[D];
      i16 Sz = Size(Queue);
      for (i16 I = 0; I < Sz; ++I)
      {
        const grid& G = Queue[0].Grid;
        grid_split Gs = SplitAlternate(G, dimension(D));
        v3<i8> NextLevel3 = Queue[0].Level3;
        ++NextLevel3[D];
        v3<i8> NextLowHigh3 = Queue[0].LowHigh3;
        idx2_Assert(NextLowHigh3[D] == 0);
        NextLowHigh3[D] = 1;
        PushBack(&Queue,
                 subband{ Gs.First, Gs.First, NextLevel3, NextLevel3, Queue[0].LowHigh3, Level });
        PushBack(
          &Queue,
          subband{ Gs.Second, Gs.Second, Queue[0].Level3, Queue[0].Level3, NextLowHigh3, Level });
        PopFront(&Queue);
      }
    }
  }
  if (Size(Queue) > 0)
    PushBack(Subbands, Queue[0]);
  Reverse(Begin(Grids), Begin(Grids) + Level + 1);
  i64 Sz = Size(*Subbands);
  for (i64 I = 0; I < Sz; ++I)
  {
    subband& Sband = (*Subbands)[I];
    Sband.Level3 = MaxLevel3 - Sband.Level3Rev;
    Sband.Level = i8(NLevels - Sband.Level - 1);
    Sband.AccumGrid = MergeSubbandGrids(Grids[Sband.Level], Sband.Grid);
  }
  Reverse(Begin(*Subbands), End(*Subbands));
}